

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Int ft_var_get_item_delta
                 (TT_Face face,GX_ItemVarStore itemStore,FT_UInt outerIndex,FT_UInt innerIndex)

{
  GX_ItemVarData pGVar1;
  FT_Short *pFVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  FT_Long FVar10;
  uint uVar11;
  long b_;
  ulong uVar12;
  FT_Fixed *pFVar13;
  int iVar14;
  long a_;
  ulong uVar15;
  
  pGVar1 = itemStore->varData;
  uVar6 = pGVar1[outerIndex].regionIdxCount;
  uVar11 = innerIndex * uVar6;
  pFVar2 = pGVar1[outerIndex].deltaSet;
  iVar14 = 0;
  for (uVar12 = 0; uVar12 < uVar6; uVar12 = uVar12 + 1) {
    pFVar13 = &(itemStore->varRegionList[pGVar1[outerIndex].regionIndices[uVar12]].axisList)->
               endCoord;
    uVar8 = 0x10000;
    for (uVar15 = 0; uVar15 < itemStore->axisCount; uVar15 = uVar15 + 1) {
      lVar9 = ((GX_AxisCoordsRec_ *)(pFVar13 + -2))->startCoord;
      lVar3 = pFVar13[-1];
      iVar7 = 0x10000;
      if (lVar9 <= lVar3) {
        lVar4 = *pFVar13;
        b_ = lVar4 - lVar3;
        if (lVar3 <= lVar4) {
          if ((lVar3 != 0) && (-1 < lVar9 || lVar4 < 1)) {
            lVar5 = face->blend->normalizedcoords[uVar15];
            if (lVar5 < lVar9) {
              iVar7 = 0;
            }
            else {
              iVar7 = 0;
              a_ = lVar4 - lVar5;
              if ((lVar5 <= lVar4) && (iVar7 = 0x10000, lVar5 != lVar3)) {
                if (lVar5 < lVar3) {
                  b_ = lVar3 - lVar9;
                  a_ = lVar5 - lVar9;
                }
                FVar10 = FT_DivFix(a_,b_);
                iVar7 = (int)FVar10;
              }
            }
          }
        }
      }
      lVar9 = (long)iVar7 * (long)(int)uVar8;
      uVar8 = lVar9 + (lVar9 >> 0x3f) + 0x8000U >> 0x10;
      pFVar13 = pFVar13 + 3;
    }
    lVar9 = (long)(int)((uint)(ushort)pFVar2[uVar11 + uVar12] << 0x10) * (long)(int)uVar8;
    iVar14 = iVar14 + (int)((ulong)(lVar9 + (lVar9 >> 0x3f) + 0x8000) >> 0x10);
    uVar6 = pGVar1[outerIndex].regionIdxCount;
  }
  return iVar14 + 0x8000 >> 0x10;
}

Assistant:

static FT_Int
  ft_var_get_item_delta( TT_Face          face,
                         GX_ItemVarStore  itemStore,
                         FT_UInt          outerIndex,
                         FT_UInt          innerIndex )
  {
    GX_ItemVarData  varData;
    FT_Short*       deltaSet;

    FT_UInt   master, j;
    FT_Fixed  netAdjustment = 0;     /* accumulated adjustment */
    FT_Fixed  scaledDelta;
    FT_Fixed  delta;


    /* See pseudo code from `Font Variations Overview' */
    /* in the OpenType specification.                  */

    varData  = &itemStore->varData[outerIndex];
    deltaSet = &varData->deltaSet[varData->regionIdxCount * innerIndex];

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < varData->regionIdxCount; master++ )
    {
      FT_Fixed  scalar      = FT_FIXED_ONE;
      FT_UInt   regionIndex = varData->regionIndices[master];

      GX_AxisCoords  axis = itemStore->varRegionList[regionIndex].axisList;


      /* inner loop steps through axes in this region */
      for ( j = 0; j < itemStore->axisCount; j++, axis++ )
      {
        FT_Fixed  axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( face->blend->normalizedcoords[j] < axis->startCoord ||
                  face->blend->normalizedcoords[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( face->blend->normalizedcoords[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( face->blend->normalizedcoords[j] < axis->peakCoord )
            axisScalar =
              FT_DivFix( face->blend->normalizedcoords[j] - axis->startCoord,
                         axis->peakCoord - axis->startCoord );
          else
            axisScalar =
              FT_DivFix( axis->endCoord - face->blend->normalizedcoords[j],
                         axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        scalar = FT_MulFix( scalar, axisScalar );

      } /* per-axis loop */

      /* get the scaled delta for this region */
      delta       = FT_intToFixed( deltaSet[master] );
      scaledDelta = FT_MulFix( scalar, delta );

      /* accumulate the adjustments from each region */
      netAdjustment = netAdjustment + scaledDelta;

    } /* per-region loop */

    return FT_fixedToInt( netAdjustment );
  }